

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O2

void uWS::WebSocketHandshake::generate(char *input,char *output)

{
  uint uVar1;
  int i;
  long lVar2;
  uint32_t b_output [5];
  uint32_t b_input [16];
  uint32_t last_b [16];
  uint32_t local_b8 [8];
  uint32_t local_98 [12];
  char local_68 [16];
  uint32_t local_58 [18];
  
  local_b8[0] = 0x67452301;
  local_b8[1] = 0xefcdab89;
  local_b8[2] = 0x98badcfe;
  local_b8[3] = 0x10325476;
  local_b8[4] = 0xc3d2e1f0;
  builtin_strncpy(local_68,"BA5C8CD011B5",0xd);
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = -0x80;
  local_98[8] = 0x2d453931;
  local_98[9] = 0x342d3437;
  local_98[10] = 0x44412d39;
  local_98[0xb] = 0x3543412d;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0x32353845;
  local_98[7] = 0x41464135;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    uVar1 = *(uint *)(input + lVar2 * 4);
    local_98[lVar2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  sha1(local_b8,local_98);
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0x1e0;
  sha1(local_b8,local_58);
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uVar1 = local_b8[lVar2];
    local_b8[lVar2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  base64((uchar *)local_b8,output);
  return;
}

Assistant:

static inline void generate(const char input[24], char output[28]) {
        uint32_t b_output[5] = {
            0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0
        };
        uint32_t b_input[16] = {
            0, 0, 0, 0, 0, 0, 0x32353845, 0x41464135, 0x2d453931, 0x342d3437, 0x44412d39,
            0x3543412d, 0x43354142, 0x30444338, 0x35423131, 0x80000000
        };

        for (int i = 0; i < 6; i++) {
            b_input[i] = (input[4 * i + 3] & 0xff) | (input[4 * i + 2] & 0xff) << 8 | (input[4 * i + 1] & 0xff) << 16 | (input[4 * i + 0] & 0xff) << 24;
        }
        sha1(b_output, b_input);
        uint32_t last_b[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 480};
        sha1(b_output, last_b);
        for (int i = 0; i < 5; i++) {
            uint32_t tmp = b_output[i];
            char *bytes = (char *) &b_output[i];
            bytes[3] = (char) (tmp & 0xff);
            bytes[2] = (char) ((tmp >> 8) & 0xff);
            bytes[1] = (char) ((tmp >> 16) & 0xff);
            bytes[0] = (char) ((tmp >> 24) & 0xff);
        }
        base64((unsigned char *) b_output, output);
    }